

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this)

{
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RDI;
  Half *in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  pmr::polymorphic_allocator<pbrt::Half>::deallocate_object<pbrt::Half>
            (&in_RDI->alloc,in_stack_ffffffffffffffe8,0x4d22ac);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }